

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * wasm::printStackIR(StackIR *ir,ostream *o,Function *func)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  Name *pNVar7;
  Try *pTVar8;
  uint uVar9;
  uint *puVar10;
  Name name;
  Name name_00;
  Try *curr_1;
  Try *curr;
  uint local_b4;
  PrintExpressionContents local_b0;
  value_type local_80;
  StackInst *inst;
  undefined1 local_70 [4];
  Index i;
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  undefined1 auStack_38 [4];
  int controlFlowDepth;
  anon_class_16_2_d966b294 doIndent;
  size_t indent;
  Function *func_local;
  ostream *o_local;
  StackIR *ir_local;
  ostream *o_00;
  
  iVar3 = 0;
  if (func != (Function *)0x0) {
    iVar3 = 2;
  }
  doIndent.indent = (size_t *)(long)iVar3;
  doIndent.o = (ostream *)&doIndent.indent;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  _auStack_38 = o;
  SmallVector<unsigned_int,_4UL>::SmallVector((SmallVector<unsigned_int,_4UL> *)local_70);
  inst._4_4_ = 0;
  do {
    uVar4 = (ulong)inst._4_4_;
    sVar5 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(ir);
    if (sVar5 <= uVar4) {
      if (catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        __assert_fail("controlFlowDepth == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                      ,0xe98,
                      "std::ostream &wasm::printStackIR(StackIR *, std::ostream &, Function *)");
      }
      SmallVector<unsigned_int,_4UL>::~SmallVector((SmallVector<unsigned_int,_4UL> *)local_70);
      return o;
    }
    ppSVar6 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                        (ir,(ulong)inst._4_4_);
    local_80 = *ppSVar6;
    if (local_80 != (value_type)0x0) {
      puVar10 = &switchD_01979749::switchdataD_02124a80;
      switch(local_80->op) {
      case Basic:
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        bVar2 = Expression::is<wasm::Pop>(local_80->origin);
        if (!bVar2) {
          PrintExpressionContents::PrintExpressionContents(&local_b0,func,o);
          Visitor<wasm::PrintExpressionContents,_void>::visit
                    ((Visitor<wasm::PrintExpressionContents,_void> *)&local_b0,local_80->origin);
        }
        break;
      case IfElse:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        printMedium(o,"else");
        doIndent.indent = (size_t *)((long)doIndent.indent + 1);
        break;
      case TryBegin:
        local_b4 = 0;
        SmallVector<unsigned_int,_4UL>::push_back
                  ((SmallVector<unsigned_int,_4UL> *)local_70,&local_b4);
      case BlockBegin:
      case IfBegin:
      case LoopBegin:
        catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             catchIndexStack.flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        PrintExpressionContents::PrintExpressionContents((PrintExpressionContents *)&curr,func,o);
        Visitor<wasm::PrintExpressionContents,_void>::visit
                  ((Visitor<wasm::PrintExpressionContents,_void> *)&curr,local_80->origin);
        doIndent.indent = (size_t *)((long)doIndent.indent + 1);
        break;
      case Catch:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        printMedium(o,"catch ");
        pTVar8 = Expression::cast<wasm::Try>(local_80->origin);
        puVar10 = SmallVector<unsigned_int,_4UL>::back((SmallVector<unsigned_int,_4UL> *)local_70);
        uVar1 = *puVar10;
        uVar9 = uVar1 + 1;
        o_00 = (ostream *)(ulong)uVar9;
        *puVar10 = uVar9;
        pNVar7 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pTVar8->catchTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar1
                           );
        name.super_IString.str._M_str = (char *)o;
        name.super_IString.str._M_len = (size_t)(pNVar7->super_IString).str._M_str;
        anon_unknown_217::printName
                  ((anon_unknown_217 *)(pNVar7->super_IString).str._M_len,name,o_00);
        doIndent.indent = (size_t *)((long)doIndent.indent + 1);
        break;
      case CatchAll:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        printMedium(o,"catch_all");
        doIndent.indent = (size_t *)((long)doIndent.indent + 1);
        break;
      case Delegate:
        catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             catchIndexStack.flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        printMedium(o,"delegate ");
        pTVar8 = Expression::cast<wasm::Try>(local_80->origin);
        bVar2 = IString::operator==(&(pTVar8->delegateTarget).super_IString,
                                    (IString *)&DELEGATE_CALLER_TARGET);
        if (bVar2) {
          std::ostream::operator<<
                    (o,catchIndexStack.flexible.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
        }
        else {
          name_00.super_IString.str._M_str = (char *)o;
          name_00.super_IString.str._M_len =
               (size_t)(pTVar8->delegateTarget).super_IString.str._M_str;
          anon_unknown_217::printName
                    ((anon_unknown_217 *)(pTVar8->delegateTarget).super_IString.str._M_len,name_00,
                     (ostream *)puVar10);
        }
        break;
      case TryEnd:
        SmallVector<unsigned_int,_4UL>::pop_back((SmallVector<unsigned_int,_4UL> *)local_70);
      case BlockEnd:
      case IfEnd:
      case LoopEnd:
        catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             catchIndexStack.flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)auStack_38);
        printMedium(o,"end");
        break;
      default:
        handle_unreachable("unexpeted op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                           ,0xe94);
      }
      std::operator<<(o,'\n');
    }
    inst._4_4_ = inst._4_4_ + 1;
  } while( true );
}

Assistant:

static std::ostream&
printStackIR(StackIR* ir, std::ostream& o, Function* func) {
  size_t indent = func ? 2 : 0;
  auto doIndent = [&]() { o << std::string(indent, ' '); };

  int controlFlowDepth = 0;
  // Stack to track indices of catches within a try
  SmallVector<Index, 4> catchIndexStack;
  for (Index i = 0; i < (*ir).size(); i++) {
    auto* inst = (*ir)[i];
    if (!inst) {
      continue;
    }
    switch (inst->op) {
      case StackInst::Basic: {
        doIndent();
        // Pop is a pseudo instruction and should not be printed in the stack IR
        // format to make it valid wat form.
        if (inst->origin->is<Pop>()) {
          break;
        }

        PrintExpressionContents(func, o).visit(inst->origin);
        break;
      }
      case StackInst::TryBegin:
        catchIndexStack.push_back(0);
        [[fallthrough]];
      case StackInst::BlockBegin:
      case StackInst::IfBegin:
      case StackInst::LoopBegin: {
        controlFlowDepth++;
        doIndent();
        PrintExpressionContents(func, o).visit(inst->origin);
        indent++;
        break;
      }
      case StackInst::TryEnd:
        catchIndexStack.pop_back();
        [[fallthrough]];
      case StackInst::BlockEnd:
      case StackInst::IfEnd:
      case StackInst::LoopEnd: {
        controlFlowDepth--;
        indent--;
        doIndent();
        printMedium(o, "end");
        break;
      }
      case StackInst::IfElse: {
        indent--;
        doIndent();
        printMedium(o, "else");
        indent++;
        break;
      }
      case StackInst::Catch: {
        indent--;
        doIndent();
        printMedium(o, "catch ");
        Try* curr = inst->origin->cast<Try>();
        printName(curr->catchTags[catchIndexStack.back()++], o);
        indent++;
        break;
      }
      case StackInst::CatchAll: {
        indent--;
        doIndent();
        printMedium(o, "catch_all");
        indent++;
        break;
      }
      case StackInst::Delegate: {
        controlFlowDepth--;
        indent--;
        doIndent();
        printMedium(o, "delegate ");
        Try* curr = inst->origin->cast<Try>();
        if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
          o << controlFlowDepth;
        } else {
          printName(curr->delegateTarget, o);
        }
        break;
      }
      default:
        WASM_UNREACHABLE("unexpeted op");
    }
    o << '\n';
  }
  assert(controlFlowDepth == 0);
  return o;
}